

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_connect(Curl_easy *data,_Bool *done)

{
  undefined1 *puVar1;
  connectdata *conn;
  CURLcode CVar2;
  
  conn = data->conn;
  *done = false;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 120000;
  (conn->proto).ftpc.pp.statemachine = ftp_statemachine;
  (conn->proto).ftpc.pp.endofresp = ftp_endofresp;
  if ((conn->handler->flags & 1) != 0) {
    CVar2 = Curl_ssl_connect(data,conn,0);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    puVar1 = &(conn->bits).field_0x6;
    *puVar1 = *puVar1 | 0x20;
  }
  Curl_pp_setup(&(conn->proto).ftpc.pp);
  Curl_pp_init(data,&(conn->proto).ftpc.pp);
  (data->conn->proto).ftpc.state = FTP_WAIT220;
  CVar2 = ftp_multi_statemach(data,done);
  return CVar2;
}

Assistant:

static CURLcode ftp_connect(struct Curl_easy *data,
                            bool *done) /* see description above */
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections on ftp */
  connkeep(conn, "FTP default");

  PINGPONG_SETUP(pp, ftp_statemachine, ftp_endofresp);

  if(conn->handler->flags & PROTOPT_SSL) {
    /* BLOCKING */
    result = Curl_ssl_connect(data, conn, FIRSTSOCKET);
    if(result)
      return result;
    conn->bits.ftp_use_control_ssl = TRUE;
  }

  Curl_pp_setup(pp); /* once per transfer */
  Curl_pp_init(data, pp); /* init the generic pingpong data */

  /* When we connect, we start in the state where we await the 220
     response */
  state(data, FTP_WAIT220);

  result = ftp_multi_statemach(data, done);

  return result;
}